

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

bool PrepareArgumentsForFunctionCall
               (ExpressionContext *ctx,SynBase *source,ArrayView<ArgumentData> functionArguments,
               ArrayView<ArgumentData> arguments,SmallArray<CallArgumentData,_16U> *result,
               uint *extraRating,bool prepareValues)

{
  undefined8 *puVar1;
  SynBase *source_00;
  TypeBase *pTVar2;
  Allocator *pAVar3;
  TypeStruct *type;
  undefined1 auVar4 [12];
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  TypeUnsizedArray *type_00;
  ArgumentData *pAVar7;
  TypeUnsizedArray *type_01;
  CallArgumentData *pCVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TypeArray *pTVar9;
  undefined4 extraout_var_02;
  ExprBase *pEVar10;
  uint i;
  uint uVar11;
  uint index;
  ExprBase **ppEVar12;
  uint uVar13;
  ulong uVar14;
  ArgumentData *pAVar15;
  uint uVar16;
  long lVar17;
  SynIdentifier **ppSVar18;
  ulong uVar19;
  long lVar20;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  IntrusiveList<ExprBase> values;
  SynBase *local_78;
  ArrayView<ArgumentData> functionArguments_local;
  
  pAVar15 = arguments.data;
  pAVar7 = functionArguments.data;
  uVar16 = arguments.count;
  uVar13 = functionArguments.count;
  result->count = 0;
  auVar4 = arguments._0_12_;
  arguments_00._12_4_ = 0;
  arguments_00.data = (ArgumentData *)auVar4._0_8_;
  arguments_00.count = auVar4._8_4_;
  functionArguments_local.data = pAVar7;
  functionArguments_local.count = uVar13;
  bVar5 = HasNamedCallArguments(arguments_00);
  uVar19 = (ulong)uVar13;
  if (bVar5) {
    arguments_01._12_4_ = 0;
    arguments_01.data = (ArgumentData *)auVar4._0_8_;
    arguments_01.count = auVar4._8_4_;
    bVar5 = HasMatchingArgumentNames(&functionArguments_local,arguments_01);
    if (bVar5) {
      for (lVar17 = 0;
          ((ulong)uVar16 * 0x30 - lVar17 != 0 && (*(long *)((long)&pAVar15->name + lVar17) == 0));
          lVar17 = lVar17 + 0x30) {
        puVar1 = (undefined8 *)((long)&pAVar15->type + lVar17);
        values.head = (ExprBase *)*puVar1;
        values.tail = (ExprBase *)puVar1[1];
        SmallArray<CallArgumentData,_16U>::push_back(result,(CallArgumentData *)&values);
      }
      index = result->count;
      for (uVar11 = index; uVar11 < uVar13; uVar11 = uVar11 + 1) {
        values.head = (ExprBase *)0x0;
        values.tail = (ExprBase *)0x0;
        SmallArray<CallArgumentData,_16U>::push_back(result,(CallArgumentData *)&values);
      }
      for (uVar11 = index; uVar11 < uVar16; uVar11 = uVar11 + 1) {
        if (pAVar15[uVar11].name != (SynIdentifier *)0x0) {
          ppSVar18 = &pAVar7->name;
          for (uVar14 = 0; uVar14 < uVar19; uVar14 = uVar14 + 1) {
            if ((*ppSVar18 != (SynIdentifier *)0x0) &&
               (bVar5 = InplaceStr::operator==(&(*ppSVar18)->name,&(pAVar15[uVar11].name)->name),
               bVar5)) {
              pCVar8 = SmallArray<CallArgumentData,_16U>::operator[](result,(uint)uVar14);
              if (pCVar8->type != (TypeBase *)0x0) {
                anon_unknown.dwarf_ff84f::Stop
                          (ctx,(pAVar15[uVar11].value)->source,
                           "ERROR: argument \'%.*s\' is already set",
                           (ulong)(uint)(*(int *)&((pAVar15[uVar11].name)->name).end -
                                        (int)((pAVar15[uVar11].name)->name).begin));
              }
              pTVar2 = pAVar15[uVar11].type;
              pEVar10 = pAVar15[uVar11].value;
              pCVar8 = SmallArray<CallArgumentData,_16U>::operator[](result,(uint)uVar14);
              pCVar8->type = pTVar2;
              pCVar8->value = pEVar10;
              break;
            }
            ppSVar18 = ppSVar18 + 6;
          }
        }
      }
      ppEVar12 = &pAVar7->value;
      for (uVar14 = 0; uVar14 < uVar19; uVar14 = uVar14 + 1) {
        pCVar8 = SmallArray<CallArgumentData,_16U>::operator[](result,(uint)uVar14);
        if ((pCVar8->type == (TypeBase *)0x0) && (pEVar10 = *ppEVar12, pEVar10 != (ExprBase *)0x0))
        {
          pTVar2 = pEVar10->type;
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          ExprPassthrough::ExprPassthrough
                    ((ExprPassthrough *)CONCAT44(extraout_var_00,iVar6),pEVar10->source,
                     pEVar10->type,pEVar10);
          pCVar8 = SmallArray<CallArgumentData,_16U>::operator[](result,(uint)uVar14);
          pCVar8->type = pTVar2;
          pCVar8->value = (ExprBase *)CONCAT44(extraout_var_00,iVar6);
        }
        ppEVar12 = ppEVar12 + 6;
      }
      do {
        if (uVar13 <= index) goto LAB_001d09c2;
        pCVar8 = SmallArray<CallArgumentData,_16U>::operator[](result,index);
        index = index + 1;
      } while (pCVar8->type != (TypeBase *)0x0);
    }
    bVar5 = false;
  }
  else {
    for (lVar17 = 0; (ulong)uVar16 * 0x30 - lVar17 != 0; lVar17 = lVar17 + 0x30) {
      puVar1 = (undefined8 *)((long)&pAVar15->type + lVar17);
      values.head = (ExprBase *)*puVar1;
      values.tail = (ExprBase *)puVar1[1];
      SmallArray<CallArgumentData,_16U>::push_back(result,(CallArgumentData *)&values);
    }
    uVar14 = (ulong)result->count;
    ppEVar12 = &pAVar7[uVar14].value;
    for (; uVar14 < uVar19; uVar14 = uVar14 + 1) {
      pEVar10 = *ppEVar12;
      if (pEVar10 != (ExprBase *)0x0) {
        pTVar2 = pEVar10->type;
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        ExprPassthrough::ExprPassthrough
                  ((ExprPassthrough *)CONCAT44(extraout_var,iVar6),pEVar10->source,pEVar10->type,
                   pEVar10);
        values.head = (ExprBase *)pTVar2;
        values.tail = (ExprBase *)CONCAT44(extraout_var,iVar6);
        SmallArray<CallArgumentData,_16U>::push_back(result,(CallArgumentData *)&values);
      }
      ppEVar12 = ppEVar12 + 6;
    }
    type_00 = ExpressionContext::GetUnsizedArrayType(ctx,&ctx->typeAutoRef->super_TypeBase);
    if (((((uVar13 != 0) &&
          (pAVar7 = ArrayView<ArgumentData>::back(&functionArguments_local),
          (TypeUnsizedArray *)pAVar7->type == type_00)) &&
         (pAVar7 = ArrayView<ArgumentData>::back(&functionArguments_local),
         pAVar7->isExplicit == false)) && (functionArguments_local.count - 1 <= result->count)) &&
       ((result->count != functionArguments_local.count ||
        (pCVar8 = SmallArray<CallArgumentData,_16U>::back(result),
        (TypeUnsizedArray *)pCVar8->type != type_00)))) {
      if (extraRating != (uint *)0x0) {
        *extraRating = (~functionArguments_local.count + result->count) * 5 + 10;
      }
      if (prepareValues) {
        local_78 = source;
        if (result->count != 0) {
          pCVar8 = SmallArray<CallArgumentData,_16U>::operator[](result,0);
          local_78 = pCVar8->value->source;
        }
        values.head = (ExprBase *)0x0;
        values.tail = (ExprBase *)0x0;
        for (uVar13 = functionArguments_local.count - 1; uVar13 < result->count; uVar13 = uVar13 + 1
            ) {
          pCVar8 = SmallArray<CallArgumentData,_16U>::operator[](result,uVar13);
          pEVar10 = pCVar8->value;
          pTVar2 = pEVar10->type;
          if ((pTVar2 != (TypeBase *)0x0) && (pTVar2->typeID == 0x13)) {
            source_00 = pEVar10->source;
            type_01 = ExpressionContext::GetUnsizedArrayType
                                (ctx,(TypeBase *)pTVar2[1]._vptr_TypeBase);
            pEVar10 = CreateCast(ctx,source_00,pEVar10,(TypeBase *)type_01,false);
          }
          pEVar10 = CreateCast(ctx,pEVar10->source,pEVar10,&ctx->typeAutoRef->super_TypeBase,true);
          IntrusiveList<ExprBase>::push_back(&values,pEVar10);
        }
        pAVar3 = ctx->allocator;
        if (values.head == (ExprBase *)0x0) {
          iVar6 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
          pEVar10 = (ExprBase *)CONCAT44(extraout_var_02,iVar6);
          pTVar2 = ctx->typeNullPtr;
          pEVar10->typeID = 9;
          pEVar10->source = local_78;
          pEVar10->type = pTVar2;
          pEVar10->next = (ExprBase *)0x0;
          pEVar10->listed = false;
          pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e35c8;
        }
        else {
          iVar6 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x40);
          pEVar10 = (ExprBase *)CONCAT44(extraout_var_01,iVar6);
          type = ctx->typeAutoRef;
          uVar13 = IntrusiveList<ExprBase>::size(&values);
          pTVar9 = ExpressionContext::GetArrayType(ctx,&type->super_TypeBase,(ulong)uVar13);
          pEVar10->typeID = 0xf;
          pEVar10->source = local_78;
          pEVar10->type = &pTVar9->super_TypeBase;
          pEVar10->next = (ExprBase *)0x0;
          pEVar10->listed = false;
          pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3718;
          pEVar10[1]._vptr_ExprBase = (_func_int **)values.head;
          *(ExprBase **)&pEVar10[1].typeID = values.tail;
        }
        pEVar10 = CreateCast(ctx,local_78,pEVar10,(TypeBase *)type_00,true);
      }
      else {
        pEVar10 = (ExprBase *)0x0;
      }
      SmallArray<CallArgumentData,_16U>::shrink(result,functionArguments_local.count - 1);
      values.head = (ExprBase *)type_00;
      values.tail = pEVar10;
      SmallArray<CallArgumentData,_16U>::push_back(result,(CallArgumentData *)&values);
    }
LAB_001d09c2:
    uVar13 = result->count;
    bVar5 = uVar13 == functionArguments_local.count;
    if (prepareValues && bVar5) {
      lVar17 = 8;
      lVar20 = 0x18;
      for (uVar19 = 0; uVar19 < uVar13; uVar19 = uVar19 + 1) {
        pCVar8 = result->data;
        pEVar10 = *(ExprBase **)((long)&pCVar8->type + lVar17);
        if (pEVar10 == (ExprBase *)0x0) {
          __assert_fail("argument.value",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x1685,
                        "bool PrepareArgumentsForFunctionCall(ExpressionContext &, SynBase *, ArrayView<ArgumentData>, ArrayView<ArgumentData>, SmallArray<CallArgumentData, 16> &, unsigned int *, bool)"
                       );
        }
        pEVar10 = CreateCast(ctx,pEVar10->source,pEVar10,
                             *(TypeBase **)((long)&(functionArguments_local.data)->source + lVar20),
                             true);
        *(ExprBase **)((long)&pCVar8->type + lVar17) = pEVar10;
        uVar13 = result->count;
        lVar17 = lVar17 + 0x10;
        lVar20 = lVar20 + 0x30;
      }
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool PrepareArgumentsForFunctionCall(ExpressionContext &ctx, SynBase *source, ArrayView<ArgumentData> functionArguments, ArrayView<ArgumentData> arguments, SmallArray<CallArgumentData, 16> &result, unsigned *extraRating, bool prepareValues)
{
	result.clear();

	if(HasNamedCallArguments(arguments))
	{
		if(!HasMatchingArgumentNames(functionArguments, arguments))
			return false;

		// Add first unnamed arguments
		for(unsigned i = 0; i < arguments.count; i++)
		{
			ArgumentData &argument = arguments.data[i];

			if(!argument.name)
				result.push_back(CallArgumentData(argument.type, argument.value));
			else
				break;
		}

		unsigned unnamedCount = result.size();

		// Reserve slots for all remaining arguments
		for(unsigned i = unnamedCount; i < functionArguments.count; i++)
			result.push_back(CallArgumentData(NULL, NULL));

		// Put named arguments in appropriate slots
		for(unsigned i = unnamedCount; i < arguments.count; i++)
		{
			ArgumentData &argument = arguments.data[i];

			if(!argument.name)
				continue;

			unsigned targetPos = 0;

			for(unsigned k = 0; k < functionArguments.count; k++)
			{
				ArgumentData &functionArgument = functionArguments.data[k];

				if(functionArgument.name && functionArgument.name->name == argument.name->name)
				{
					if(result[targetPos].type != NULL)
						Stop(ctx, argument.value->source, "ERROR: argument '%.*s' is already set", FMT_ISTR(argument.name->name));

					result[targetPos] = CallArgumentData(argument.type, argument.value);
					break;
				}

				targetPos++;
			}
		}

		// Fill in any unset arguments with default values
		for(unsigned i = 0; i < functionArguments.count; i++)
		{
			ArgumentData &argument = functionArguments.data[i];

			if(result[i].type == NULL)
			{
				if(ExprBase *value = argument.value)
					result[i] = CallArgumentData(value->type, new (ctx.get<ExprPassthrough>()) ExprPassthrough(value->source, value->type, value));
			}
		}

		// All arguments must be set
		for(unsigned i = unnamedCount; i < functionArguments.count; i++)
		{
			if(result[i].type == NULL)
				return false;
		}
	}
	else
	{
		// Add arguments
		for(unsigned i = 0; i < arguments.count; i++)
		{
			ArgumentData &argument = arguments.data[i];

			result.push_back(CallArgumentData(argument.type, argument.value));
		}

		// Add any arguments with default values
		for(unsigned i = result.count; i < functionArguments.count; i++)
		{
			ArgumentData &argument = functionArguments.data[i];

			if(ExprBase *value = argument.value)
				result.push_back(CallArgumentData(value->type, new (ctx.get<ExprPassthrough>()) ExprPassthrough(value->source, value->type, value)));
		}

		// Create variadic pack if neccessary
		TypeBase *varArgType = ctx.GetUnsizedArrayType(ctx.typeAutoRef);

		if(!functionArguments.empty() && functionArguments.back().type == varArgType && !functionArguments.back().isExplicit)
		{
			if(result.size() >= functionArguments.size() - 1 && !(result.size() == functionArguments.size() && result.back().type == varArgType))
			{
				if(extraRating)
					*extraRating = 10 + (result.size() - functionArguments.size() - 1) * 5;

				ExprBase *value = NULL;

				if(prepareValues)
				{
					if(!result.empty())
						source = result[0].value->source;

					IntrusiveList<ExprBase> values;

					for(unsigned i = functionArguments.size() - 1; i < result.size(); i++)
					{
						ExprBase *value = result[i].value;

						if(TypeArray *arrType = getType<TypeArray>(value->type))
						{
							// type[N] is converted to type[] first
							value = CreateCast(ctx, value->source, value, ctx.GetUnsizedArrayType(arrType->subType), false);
						}

						values.push_back(CreateCast(ctx, value->source, value, ctx.typeAutoRef, true));
					}

					if(values.empty())
						value = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, ctx.typeNullPtr);
					else
						value = new (ctx.get<ExprArray>()) ExprArray(source, ctx.GetArrayType(ctx.typeAutoRef, values.size()), values);

					value = CreateCast(ctx, source, value, varArgType, true);
				}

				result.shrink(functionArguments.size() - 1);
				result.push_back(CallArgumentData(varArgType, value));
			}
		}
	}

	if(result.size() != functionArguments.size())
		return false;

	// Convert all arguments to target type if this is a real call
	if(prepareValues)
	{
		for(unsigned i = 0; i < result.count; i++)
		{
			CallArgumentData &argument = result.data[i];

			assert(argument.value);

			TypeBase *target = functionArguments.data[i].type;

			argument.value = CreateCast(ctx, argument.value->source, argument.value, target, true);
		}
	}

	return true;
}